

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

bool __thiscall
Clasp::ShortImplicationsGraph::propagateBin
          (ShortImplicationsGraph *this,Assignment *out,Literal p,uint32 level)

{
  bool bVar1;
  uint32 uVar2;
  const_reference this_00;
  Assignment *this_01;
  Assignment *pAVar3;
  undefined4 in_ECX;
  Literal *in_RSI;
  pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
  *in_RDI;
  const_left_iterator end;
  const_left_iterator it;
  Antecedent ante;
  ImplicationList *x;
  Literal *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb8;
  Literal in_stack_ffffffffffffffd0;
  Literal local_8 [2];
  
  uVar2 = Literal::id(local_8);
  this_00 = bk_lib::
            pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
            ::operator[](in_RDI,uVar2);
  Antecedent::Antecedent
            ((Antecedent *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  this_01 = (Assignment *)
            bk_lib::detail::
            left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::left_begin
                      ((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *
                       )0x1d0ee4);
  pAVar3 = (Assignment *)
           bk_lib::detail::
           left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::left_end
                     ((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                      this_00);
  while( true ) {
    if (this_01 == pAVar3) {
      return true;
    }
    uVar2 = *(uint32 *)&(this_01->trail).ebo_.buf;
    Antecedent::Antecedent((Antecedent *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),in_RSI);
    bVar1 = Assignment::assign(this_01,in_stack_ffffffffffffffd0,(uint32)((ulong)pAVar3 >> 0x20),
                               (Antecedent *)CONCAT44(uVar2,in_stack_ffffffffffffffb8));
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    this_01 = (Assignment *)((long)&(this_01->trail).ebo_.buf + 4);
  }
  return false;
}

Assistant:

bool ShortImplicationsGraph::propagateBin(Assignment& out, Literal p, uint32 level) const {
	const ImplicationList& x = graph_[p.id()];
	Antecedent ante(p);
	for (ImplicationList::const_left_iterator it = x.left_begin(), end = x.left_end(); it != end; ++it) {
		if (!out.assign(*it, level, p)) { return false; }
	}
	return true;
}